

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitStringConst(InfoCollector *this,StringConst *curr)

{
  allocator<char> local_81;
  string local_80 [32];
  string_view local_60;
  Literal local_50;
  PossibleContents local_38;
  StringConst *local_18;
  StringConst *curr_local;
  InfoCollector *this_local;
  
  local_18 = curr;
  curr_local = (StringConst *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (local_80,(basic_string_view<char,_std::char_traits<char>_> *)&curr->string,&local_81);
  local_60 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_80);
  wasm::Literal::Literal(&local_50,local_60);
  PossibleContents::literal(&local_38,&local_50);
  addRoot(this,(Expression *)curr,&local_38);
  PossibleContents::~PossibleContents(&local_38);
  wasm::Literal::~Literal(&local_50);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator(&local_81);
  return;
}

Assistant:

void visitStringConst(StringConst* curr) {
    addRoot(curr,
            PossibleContents::literal(Literal(std::string(curr->string.str))));
  }